

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O2

void __thiscall OutputFile::~OutputFile(OutputFile *this)

{
  OutputFile *this_00;
  OutputFile *pOVar1;
  
  pOVar1 = this;
  while (pOVar1 = (OutputFile *)
                  (pOVar1->descendants).
                  super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>._M_impl._M_node.
                  super__List_node_base._M_next, pOVar1 != this) {
    this_00 = (OutputFile *)
              (pOVar1->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>.
              _M_impl._M_node._M_size;
    if (this_00 != (OutputFile *)0x0) {
      ~OutputFile(this_00);
    }
    operator_delete(this_00,0xd8);
  }
  std::__cxx11::string::~string((string *)&this->keySeparator);
  std::__cxx11::string::~string((string *)&this->eol);
  std::__cxx11::string::~string((string *)&this->value);
  std::__cxx11::string::~string((string *)&this->key);
  std::__cxx11::string::~string((string *)&this->version);
  std::__cxx11::string::~string((string *)&this->name);
  std::__cxx11::_List_base<OutputFile_*,_std::allocator<OutputFile_*>_>::_M_clear
            ((_List_base<OutputFile_*,_std::allocator<OutputFile_*>_> *)this);
  return;
}

Assistant:

OutputFile::~OutputFile() {
  for (list<OutputFile*>::iterator it = descendants.begin(); it != descendants.end(); ++it) {
    delete *it;
  }
}